

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlIO(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined8 uVar17;
  xmlParserCtxtPtr pxVar18;
  char *pcVar19;
  xmlChar *pxVar20;
  long lVar21;
  xmlBufferPtr pxVar22;
  FILE *pFVar23;
  xmlOutputBufferPtr pxVar24;
  size_t sVar25;
  xmlParserInputBufferPtr pxVar26;
  int n_ctxt;
  int test_ret_4;
  ulong *puVar27;
  uint *puVar28;
  ulong in_RSI;
  ulong uVar29;
  ulong uVar30;
  undefined4 uVar31;
  int n_fd;
  int iVar32;
  uint uVar33;
  undefined4 *puVar34;
  bool bVar35;
  int n_enc;
  uint uVar36;
  undefined8 *puVar37;
  int local_d4;
  undefined4 *local_c8;
  int test_ret_2;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int test_ret;
  int test_ret_3;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int test_ret_1;
  int local_48;
  int local_44;
  
  if (quiet == '\0') {
    puts("Testing xmlIO : 40 of 50 functions ...");
  }
  bVar35 = true;
  iVar32 = 0;
  while (bVar35) {
    iVar1 = xmlMemBlocks();
    uVar17 = xmlAllocOutputBuffer(0);
    xmlOutputBufferClose(uVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar35 = false;
    printf("Leak of %d blocks found in xmlAllocOutputBuffer");
    in_RSI = 0;
    printf(" %d");
    putchar(10);
    iVar32 = iVar32 + -1;
  }
  function_tests = function_tests + 1;
  puVar34 = &DAT_001540b0;
  local_88 = 0;
  for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
    iVar1 = xmlMemBlocks();
    uVar31 = 0xffffffff;
    if (uVar36 < 3) {
      uVar31 = *puVar34;
    }
    xmlAllocParserInputBuffer(uVar31);
    xmlFreeParserInputBuffer();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlAllocParserInputBuffer",(ulong)(uint)(iVar2 - iVar1));
      local_88 = local_88 + 1;
      in_RSI = (ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
    puVar34 = puVar34 + 1;
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
    iVar1 = xmlMemBlocks();
    xmlCheckFilename();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckFilename",(ulong)(uint)(iVar2 - iVar1));
      local_8c = local_8c + 1;
      in_RSI = (ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  test_ret = 0;
  do {
    if (iVar1 == 3) {
      function_tests = function_tests + 1;
      iVar1 = xmlMemBlocks();
      xmlCleanupInputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar3 = xmlMemBlocks();
        in_RSI = (ulong)(uint)(iVar3 - iVar1);
        printf("Leak of %d blocks found in xmlCleanupInputCallbacks");
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar3 = xmlMemBlocks();
      xmlCleanupOutputCallbacks();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar5 = xmlMemBlocks();
        in_RSI = (ulong)(uint)(iVar5 - iVar3);
        printf("Leak of %d blocks found in xmlCleanupOutputCallbacks");
        putchar(10);
      }
      function_tests = function_tests + 1;
      local_90 = 0;
      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        xmlFileClose();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlFileClose",(ulong)(uint)(iVar6 - iVar5));
          local_90 = local_90 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_94 = 0;
      for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        gen_filepath(uVar36,(int)in_RSI);
        xmlFileMatch();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlFileMatch",(ulong)(uint)(iVar6 - iVar5));
          local_94 = local_94 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_98 = 0;
      for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        gen_filepath(uVar36,(int)in_RSI);
        xmlFileOpen();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlFileOpen",(ulong)(uint)(iVar6 - iVar5));
          local_98 = local_98 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_44 = 0;
      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
        bVar35 = true;
        while (bVar35) {
          uVar30 = 0;
          while( true ) {
            iVar5 = (int)in_RSI;
            iVar6 = (int)uVar30;
            if (iVar6 == 4) break;
            iVar7 = xmlMemBlocks();
            iVar5 = gen_int(iVar6,iVar5);
            in_RSI = 0;
            xmlFileRead(0,0,iVar5);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar7 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlFileRead",(ulong)(uint)(iVar5 - iVar7));
              local_44 = local_44 + 1;
              printf(" %d",(ulong)uVar36);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = uVar30;
            }
            uVar30 = (ulong)(iVar6 + 1);
          }
          bVar35 = false;
        }
      }
      function_tests = function_tests + 1;
      local_9c = 0;
      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        xmlIOFTPClose();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIOFTPClose",(ulong)(uint)(iVar6 - iVar5));
          local_9c = local_9c + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_a0 = 0;
      for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        gen_filepath(uVar36,(int)in_RSI);
        xmlIOFTPMatch();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIOFTPMatch",(ulong)(uint)(iVar6 - iVar5));
          local_a0 = local_a0 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_a4 = 0;
      for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        gen_filepath(uVar36,(int)in_RSI);
        xmlIOFTPOpen();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIOFTPOpen",(ulong)(uint)(iVar6 - iVar5));
          local_a4 = local_a4 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_48 = 0;
      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
        bVar35 = true;
        while (bVar35) {
          uVar30 = 0;
          while( true ) {
            iVar5 = (int)in_RSI;
            iVar6 = (int)uVar30;
            if (iVar6 == 4) break;
            iVar7 = xmlMemBlocks();
            iVar5 = gen_int(iVar6,iVar5);
            in_RSI = 0;
            xmlIOFTPRead(0,0,iVar5);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar7 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlIOFTPRead",(ulong)(uint)(iVar5 - iVar7));
              local_48 = local_48 + 1;
              printf(" %d",(ulong)uVar36);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = uVar30;
            }
            uVar30 = (ulong)(iVar6 + 1);
          }
          bVar35 = false;
        }
      }
      function_tests = function_tests + 1;
      local_a8 = 0;
      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        xmlIOHTTPClose(0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIOHTTPClose",(ulong)(uint)(iVar6 - iVar5));
          local_a8 = local_a8 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_ac = 0;
      for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        pcVar19 = gen_filepath(uVar36,(int)in_RSI);
        xmlIOHTTPMatch(pcVar19);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIOHTTPMatch",(ulong)(uint)(iVar6 - iVar5));
          local_ac = local_ac + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      local_b0 = 0;
      for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        pcVar19 = gen_filepath(uVar36,(int)in_RSI);
        uVar17 = xmlIOHTTPOpen(pcVar19);
        xmlNanoHTTPClose(uVar17);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIOHTTPOpen",(ulong)(uint)(iVar6 - iVar5));
          local_b0 = local_b0 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      test_ret_1 = 0;
      for (uVar30 = 0; (int)uVar30 != 2; uVar30 = (ulong)((int)uVar30 + 1)) {
        bVar35 = true;
        while (bVar35) {
          uVar29 = 0;
          while( true ) {
            iVar5 = (int)in_RSI;
            iVar6 = (int)uVar29;
            if (iVar6 == 4) break;
            iVar7 = xmlMemBlocks();
            iVar5 = gen_int(iVar6,iVar5);
            in_RSI = 0;
            xmlIOHTTPRead(0,0,iVar5);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar7 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlIOHTTPRead",(ulong)(uint)(iVar5 - iVar7));
              test_ret_1 = test_ret_1 + 1;
              printf(" %d",uVar30);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = uVar29;
            }
            uVar29 = (ulong)(iVar6 + 1);
          }
          bVar35 = false;
        }
      }
      function_tests = function_tests + 1;
      local_50 = 0;
      for (iVar5 = 0; iVar5 != 8; iVar5 = iVar5 + 1) {
        uVar30 = 0;
        while (uVar36 = (uint)uVar30, uVar36 != 4) {
          uVar29 = 0;
          while( true ) {
            iVar6 = (int)in_RSI;
            iVar7 = (int)uVar29;
            if (iVar7 == 3) break;
            iVar8 = xmlMemBlocks();
            pcVar19 = gen_filepath(iVar5,iVar6);
            if (uVar36 < 3) {
              in_RSI = (&DAT_00167d78)[uVar30];
            }
            else {
              in_RSI = 0;
            }
            pxVar18 = gen_xmlParserCtxtPtr(iVar7,iVar6);
            uVar17 = xmlNoNetExternalEntityLoader(pcVar19,in_RSI,pxVar18);
            xmlFreeInputStream(uVar17);
            call_tests = call_tests + 1;
            if (pxVar18 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar18);
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar8 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNoNetExternalEntityLoader",
                     (ulong)(uint)(iVar6 - iVar8));
              local_50 = local_50 + 1;
              printf(" %d",iVar5);
              printf(" %d",uVar30);
              printf(" %d");
              putchar(10);
              in_RSI = uVar29;
            }
            uVar29 = (ulong)(iVar7 + 1);
          }
          uVar30 = (ulong)(uVar36 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_b4 = 0;
      for (uVar36 = 0; uVar36 != 5; uVar36 = uVar36 + 1) {
        iVar5 = xmlMemBlocks();
        pxVar20 = gen_const_xmlChar_ptr(uVar36,(int)in_RSI);
        lVar21 = xmlNormalizeWindowsPath(pxVar20);
        if (lVar21 != 0) {
          (*_xmlFree)(lVar21);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNormalizeWindowsPath",(ulong)(uint)(iVar6 - iVar5));
          local_b4 = local_b4 + 1;
          in_RSI = (ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      iVar5 = 0;
      local_7c = 0;
      do {
        if (iVar5 == 3) {
          function_tests = function_tests + 1;
          iVar5 = 0;
          local_80 = 0;
          do {
            if (iVar5 == 4) {
              function_tests = function_tests + 1;
              iVar5 = 0;
              local_84 = 0;
              do {
                if (iVar5 == 2) {
                  function_tests = function_tests + 1;
                  local_54 = 0;
                  for (uVar36 = 0; uVar36 != 6; uVar36 = uVar36 + 1) {
                    bVar35 = true;
                    while (bVar35) {
                      uVar30 = 0;
                      while( true ) {
                        iVar5 = (int)in_RSI;
                        iVar6 = (int)uVar30;
                        if (iVar6 == 4) break;
                        iVar7 = xmlMemBlocks();
                        pcVar19 = gen_fileoutput(uVar36,iVar5);
                        iVar5 = gen_int(iVar6,iVar5);
                        in_RSI = 0;
                        uVar17 = xmlOutputBufferCreateFilename(pcVar19,0,iVar5);
                        xmlOutputBufferClose(uVar17);
                        call_tests = call_tests + 1;
                        xmlResetLastError();
                        iVar5 = xmlMemBlocks();
                        if (iVar7 != iVar5) {
                          iVar5 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlOutputBufferCreateFilename",
                                 (ulong)(uint)(iVar5 - iVar7));
                          local_54 = local_54 + 1;
                          printf(" %d",(ulong)uVar36);
                          printf(" %d",0);
                          printf(" %d");
                          putchar(10);
                          in_RSI = uVar30;
                        }
                        uVar30 = (ulong)(iVar6 + 1);
                      }
                      bVar35 = false;
                    }
                  }
                  function_tests = function_tests + 1;
                  local_b8 = 0;
                  for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
                    iVar5 = xmlMemBlocks();
                    pxVar24 = gen_xmlOutputBufferPtr(uVar36,(int)in_RSI);
                    xmlOutputBufferFlush(pxVar24);
                    call_tests = call_tests + 1;
                    if (pxVar24 != (xmlOutputBufferPtr)0x0) {
                      xmlOutputBufferClose(pxVar24);
                    }
                    xmlResetLastError();
                    iVar6 = xmlMemBlocks();
                    if (iVar5 != iVar6) {
                      iVar6 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlOutputBufferFlush",
                             (ulong)(uint)(iVar6 - iVar5));
                      local_b8 = local_b8 + 1;
                      in_RSI = (ulong)uVar36;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  function_tests = function_tests + 1;
                  test_ret_2 = 0;
                  uVar30 = 0;
                  while (iVar5 = (int)uVar30, iVar5 != 2) {
                    iVar6 = xmlMemBlocks();
                    pxVar24 = gen_xmlOutputBufferPtr(iVar5,(int)in_RSI);
                    xmlOutputBufferGetContent(pxVar24);
                    call_tests = call_tests + 1;
                    if (pxVar24 != (xmlOutputBufferPtr)0x0) {
                      xmlOutputBufferClose(pxVar24);
                    }
                    xmlResetLastError();
                    iVar7 = xmlMemBlocks();
                    if (iVar6 != iVar7) {
                      iVar7 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlOutputBufferGetContent",
                             (ulong)(uint)(iVar7 - iVar6));
                      test_ret_2 = test_ret_2 + 1;
                      printf(" %d");
                      putchar(10);
                      in_RSI = uVar30;
                    }
                    uVar30 = (ulong)(iVar5 + 1);
                  }
                  function_tests = function_tests + 1;
                  iVar5 = 0;
                  local_58 = 0;
                  do {
                    if (iVar5 == 2) {
                      function_tests = function_tests + 1;
                      local_64 = 0;
                      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
                        uVar30 = 0;
                        puVar27 = &DAT_00167d78;
                        while( true ) {
                          iVar5 = (int)in_RSI;
                          uVar9 = (uint)uVar30;
                          if (uVar9 == 4) break;
                          iVar6 = xmlMemBlocks();
                          pxVar24 = gen_xmlOutputBufferPtr(uVar36,iVar5);
                          if (uVar9 < 3) {
                            in_RSI = *puVar27;
                          }
                          else {
                            in_RSI = 0;
                          }
                          xmlOutputBufferWriteString(pxVar24);
                          call_tests = call_tests + 1;
                          if (pxVar24 != (xmlOutputBufferPtr)0x0) {
                            xmlOutputBufferClose(pxVar24);
                          }
                          xmlResetLastError();
                          iVar5 = xmlMemBlocks();
                          if (iVar6 != iVar5) {
                            iVar5 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlOutputBufferWriteString",
                                   (ulong)(uint)(iVar5 - iVar6));
                            local_64 = local_64 + 1;
                            printf(" %d",(ulong)uVar36);
                            printf(" %d");
                            putchar(10);
                            in_RSI = uVar30;
                          }
                          uVar30 = (ulong)(uVar9 + 1);
                          puVar27 = puVar27 + 1;
                        }
                      }
                      function_tests = function_tests + 1;
                      local_68 = 0;
                      for (uVar30 = 0; (int)uVar30 != 4; uVar30 = (ulong)((int)uVar30 + 1)) {
                        puVar28 = &DAT_001540b0;
                        uVar29 = 0;
                        while (uVar36 = (uint)uVar29, uVar36 != 4) {
                          iVar5 = xmlMemBlocks();
                          in_RSI = 0xffffffff;
                          if (uVar36 < 3) {
                            in_RSI = (ulong)*puVar28;
                          }
                          uVar17 = xmlParserInputBufferCreateFd(0xffffffff);
                          xmlFreeParserInputBuffer(uVar17);
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar6 = xmlMemBlocks();
                          if (iVar5 != iVar6) {
                            iVar6 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlParserInputBufferCreateFd",
                                   (ulong)(uint)(iVar6 - iVar5));
                            local_68 = local_68 + 1;
                            printf(" %d",uVar30);
                            printf(" %d");
                            putchar(10);
                            in_RSI = uVar29;
                          }
                          puVar28 = puVar28 + 1;
                          uVar29 = (ulong)(uVar36 + 1);
                        }
                      }
                      function_tests = function_tests + 1;
                      local_6c = 0;
                      for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
                        uVar30 = 0;
                        puVar28 = &DAT_001540b0;
                        while( true ) {
                          iVar5 = (int)in_RSI;
                          uVar9 = (uint)uVar30;
                          if (uVar9 == 4) break;
                          iVar6 = xmlMemBlocks();
                          pFVar23 = (FILE *)gen_FILE_ptr(uVar36,iVar5);
                          in_RSI = 0xffffffffffffffff;
                          if (uVar9 < 3) {
                            in_RSI = (ulong)*puVar28;
                          }
                          uVar17 = xmlParserInputBufferCreateFile(pFVar23);
                          xmlFreeParserInputBuffer(uVar17);
                          call_tests = call_tests + 1;
                          if (pFVar23 != (FILE *)0x0) {
                            fclose(pFVar23);
                          }
                          xmlResetLastError();
                          iVar5 = xmlMemBlocks();
                          if (iVar6 != iVar5) {
                            iVar5 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlParserInputBufferCreateFile",
                                   (ulong)(uint)(iVar5 - iVar6));
                            local_6c = local_6c + 1;
                            printf(" %d",(ulong)uVar36);
                            printf(" %d");
                            putchar(10);
                            in_RSI = uVar30;
                          }
                          uVar30 = (ulong)(uVar9 + 1);
                          puVar28 = puVar28 + 1;
                        }
                      }
                      function_tests = function_tests + 1;
                      local_70 = 0;
                      uVar30 = 0;
                      while (iVar5 = (int)uVar30, iVar5 != 6) {
                        uVar29 = 0;
                        puVar28 = &DAT_001540b0;
                        while( true ) {
                          iVar6 = (int)in_RSI;
                          uVar36 = (uint)uVar29;
                          if (uVar36 == 4) break;
                          iVar7 = xmlMemBlocks();
                          pcVar19 = gen_fileoutput(iVar5,iVar6);
                          in_RSI = 0xffffffff;
                          if (uVar36 < 3) {
                            in_RSI = (ulong)*puVar28;
                          }
                          uVar17 = xmlParserInputBufferCreateFilename(pcVar19);
                          xmlFreeParserInputBuffer(uVar17);
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar6 = xmlMemBlocks();
                          if (iVar7 != iVar6) {
                            iVar6 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlParserInputBufferCreateFilename",
                                   (ulong)(uint)(iVar6 - iVar7));
                            local_70 = local_70 + 1;
                            printf(" %d",uVar30);
                            printf(" %d");
                            putchar(10);
                            in_RSI = uVar29;
                          }
                          uVar29 = (ulong)(uVar36 + 1);
                          puVar28 = puVar28 + 1;
                        }
                        uVar30 = (ulong)(iVar5 + 1);
                      }
                      function_tests = function_tests + 1;
                      local_5c = 0;
                      for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
                        for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
                          local_c8 = &DAT_001540b0;
                          uVar30 = 0;
                          while (uVar33 = (uint)uVar30, uVar33 != 4) {
                            iVar5 = xmlMemBlocks();
                            if (uVar36 == 0) {
                              bVar35 = false;
                              pcVar19 = "foo";
                            }
                            else if (uVar36 == 2) {
                              bVar35 = false;
                              pcVar19 = "test/ent2";
                            }
                            else if (uVar36 == 1) {
                              bVar35 = false;
                              pcVar19 = "<foo/>";
                            }
                            else {
                              bVar35 = true;
                              pcVar19 = (char *)0x0;
                            }
                            uVar10 = gen_int(uVar9,(int)in_RSI);
                            uVar31 = 0xffffffff;
                            if (uVar33 < 3) {
                              uVar31 = *local_c8;
                            }
                            if ((bVar35) ||
                               (sVar25 = strlen(pcVar19), (int)uVar10 <= (int)sVar25 + 1)) {
                              in_RSI = (ulong)uVar10;
                              uVar17 = xmlParserInputBufferCreateMem(pcVar19,in_RSI,uVar31);
                              xmlFreeParserInputBuffer(uVar17);
                              call_tests = call_tests + 1;
                              xmlResetLastError();
                              iVar6 = xmlMemBlocks();
                              if (iVar5 != iVar6) {
                                iVar6 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
                                       (ulong)(uint)(iVar6 - iVar5));
                                local_5c = local_5c + 1;
                                printf(" %d",(ulong)uVar36);
                                printf(" %d",(ulong)uVar9);
                                printf(" %d");
                                putchar(10);
                                in_RSI = uVar30;
                              }
                            }
                            local_c8 = local_c8 + 1;
                            uVar30 = (ulong)(uVar33 + 1);
                          }
                        }
                      }
                      function_tests = function_tests + 1;
                      local_60 = 0;
                      for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
                        for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
                          local_c8 = &DAT_001540b0;
                          uVar30 = 0;
                          while (uVar33 = (uint)uVar30, uVar33 != 4) {
                            iVar5 = xmlMemBlocks();
                            if (uVar36 == 0) {
                              bVar35 = false;
                              pcVar19 = "foo";
                            }
                            else if (uVar36 == 2) {
                              bVar35 = false;
                              pcVar19 = "test/ent2";
                            }
                            else if (uVar36 == 1) {
                              bVar35 = false;
                              pcVar19 = "<foo/>";
                            }
                            else {
                              bVar35 = true;
                              pcVar19 = (char *)0x0;
                            }
                            uVar10 = gen_int(uVar9,(int)in_RSI);
                            uVar31 = 0xffffffff;
                            if (uVar33 < 3) {
                              uVar31 = *local_c8;
                            }
                            if ((bVar35) ||
                               (sVar25 = strlen(pcVar19), (int)uVar10 <= (int)sVar25 + 1)) {
                              in_RSI = (ulong)uVar10;
                              uVar17 = xmlParserInputBufferCreateStatic(pcVar19,in_RSI,uVar31);
                              xmlFreeParserInputBuffer(uVar17);
                              call_tests = call_tests + 1;
                              xmlResetLastError();
                              iVar6 = xmlMemBlocks();
                              if (iVar5 != iVar6) {
                                iVar6 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlParserInputBufferCreateStatic"
                                       ,(ulong)(uint)(iVar6 - iVar5));
                                local_60 = local_60 + 1;
                                printf(" %d",(ulong)uVar36);
                                printf(" %d",(ulong)uVar9);
                                printf(" %d");
                                putchar(10);
                                in_RSI = uVar30;
                              }
                            }
                            local_c8 = local_c8 + 1;
                            uVar30 = (ulong)(uVar33 + 1);
                          }
                        }
                      }
                      function_tests = function_tests + 1;
                      test_ret_3 = 0;
                      uVar30 = 0;
                      while (iVar5 = (int)uVar30, iVar5 != 8) {
                        uVar29 = 0;
                        while( true ) {
                          iVar6 = (int)in_RSI;
                          iVar7 = (int)uVar29;
                          if (iVar7 == 4) break;
                          iVar8 = xmlMemBlocks();
                          pxVar26 = gen_xmlParserInputBufferPtr(iVar5,iVar6);
                          uVar36 = gen_int(iVar7,iVar6);
                          in_RSI = (ulong)uVar36;
                          xmlParserInputBufferGrow(pxVar26);
                          call_tests = call_tests + 1;
                          xmlFreeParserInputBuffer(pxVar26);
                          xmlResetLastError();
                          iVar6 = xmlMemBlocks();
                          if (iVar8 != iVar6) {
                            iVar6 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlParserInputBufferGrow",
                                   (ulong)(uint)(iVar6 - iVar8));
                            test_ret_3 = test_ret_3 + 1;
                            printf(" %d",uVar30);
                            printf(" %d");
                            putchar(10);
                            in_RSI = uVar29;
                          }
                          uVar29 = (ulong)(iVar7 + 1);
                        }
                        uVar30 = (ulong)(iVar5 + 1);
                      }
                      function_tests = function_tests + 1;
                      uVar36 = 0;
                      local_d4 = 0;
                      do {
                        if (uVar36 == 8) {
                          function_tests = function_tests + 1;
                          iVar5 = 0;
                          for (uVar36 = 0; uVar36 != 8; uVar36 = uVar36 + 1) {
                            uVar30 = 0;
                            while( true ) {
                              iVar6 = (int)in_RSI;
                              iVar7 = (int)uVar30;
                              if (iVar7 == 4) break;
                              iVar8 = xmlMemBlocks();
                              pxVar26 = gen_xmlParserInputBufferPtr(uVar36,iVar6);
                              uVar9 = gen_int(iVar7,iVar6);
                              in_RSI = (ulong)uVar9;
                              xmlParserInputBufferRead(pxVar26);
                              call_tests = call_tests + 1;
                              xmlFreeParserInputBuffer(pxVar26);
                              xmlResetLastError();
                              iVar6 = xmlMemBlocks();
                              if (iVar8 != iVar6) {
                                iVar6 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlParserInputBufferRead",
                                       (ulong)(uint)(iVar6 - iVar8));
                                iVar5 = iVar5 + 1;
                                printf(" %d",(ulong)uVar36);
                                printf(" %d");
                                putchar(10);
                                in_RSI = uVar30;
                              }
                              uVar30 = (ulong)(iVar7 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          iVar6 = xmlMemBlocks();
                          xmlPopInputCallbacks();
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar7 = xmlMemBlocks();
                          if (iVar6 != iVar7) {
                            iVar8 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlPopInputCallbacks",
                                   (ulong)(uint)(iVar8 - iVar6));
                            putchar(10);
                          }
                          function_tests = function_tests + 1;
                          iVar8 = xmlMemBlocks();
                          xmlRegisterDefaultInputCallbacks();
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar11 = xmlMemBlocks();
                          if (iVar8 != iVar11) {
                            iVar12 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlRegisterDefaultInputCallbacks",
                                   (ulong)(uint)(iVar12 - iVar8));
                            putchar(10);
                          }
                          function_tests = function_tests + 1;
                          iVar12 = xmlMemBlocks();
                          xmlRegisterDefaultOutputCallbacks();
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar13 = xmlMemBlocks();
                          if (iVar12 != iVar13) {
                            iVar14 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlRegisterDefaultOutputCallbacks",
                                   (ulong)(uint)(iVar14 - iVar12));
                            putchar(10);
                          }
                          function_tests = function_tests + 1;
                          iVar14 = xmlMemBlocks();
                          xmlRegisterHTTPPostCallbacks();
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar15 = xmlMemBlocks();
                          if (iVar14 != iVar15) {
                            iVar16 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlRegisterHTTPPostCallbacks",
                                   (ulong)(uint)(iVar16 - iVar14));
                            putchar(10);
                          }
                          function_tests = function_tests + 1;
                          iVar1 = local_5c + local_60 + test_ret_3 + local_d4 + iVar5 +
                                  local_54 + local_b8 + test_ret_2 + local_58 + local_64 + local_68
                                  + local_6c + local_70 +
                                  local_b0 + test_ret_1 + local_50 + local_b4 + local_7c + local_80
                                  + local_84 +
                                  local_9c + local_a0 + local_a4 + local_48 + local_a8 + local_ac +
                                  test_ret + local_90 + local_94 + local_98 + local_44 +
                                  (uint)(iVar14 != iVar15) + local_88 + local_8c +
                                  (uint)(iVar8 != iVar11) + (uint)(iVar12 != iVar13) +
                                  (uint)(iVar1 != iVar2) + (uint)(iVar3 != iVar4) +
                                  (uint)(iVar6 != iVar7);
                          uVar36 = -(iVar32 - iVar1);
                          if (iVar32 != iVar1) {
                            printf("Module xmlIO: %d errors\n",(ulong)uVar36);
                          }
                          return uVar36;
                        }
                        for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
                          puVar37 = &DAT_00167d78;
                          uVar30 = 0;
                          while (uVar33 = (uint)uVar30, uVar33 != 4) {
                            iVar5 = xmlMemBlocks();
                            pxVar26 = gen_xmlParserInputBufferPtr(uVar36,(int)in_RSI);
                            uVar10 = gen_int(uVar9,(int)in_RSI);
                            if (uVar33 < 3) {
                              pcVar19 = (char *)*puVar37;
                              sVar25 = strlen(pcVar19);
                              if ((int)uVar10 <= (int)sVar25 + 1) goto LAB_0013c9d7;
                            }
                            else {
                              pcVar19 = (char *)0x0;
LAB_0013c9d7:
                              in_RSI = (ulong)uVar10;
                              xmlParserInputBufferPush(pxVar26,in_RSI,pcVar19);
                              call_tests = call_tests + 1;
                              xmlFreeParserInputBuffer(pxVar26);
                              xmlResetLastError();
                              iVar6 = xmlMemBlocks();
                              if (iVar5 != iVar6) {
                                iVar6 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlParserInputBufferPush",
                                       (ulong)(uint)(iVar6 - iVar5));
                                local_d4 = local_d4 + 1;
                                printf(" %d",(ulong)uVar36);
                                printf(" %d",(ulong)uVar9);
                                printf(" %d");
                                putchar(10);
                                in_RSI = uVar30;
                              }
                            }
                            puVar37 = puVar37 + 1;
                            uVar30 = (ulong)(uVar33 + 1);
                          }
                        }
                        uVar36 = uVar36 + 1;
                      } while( true );
                    }
                    uVar30 = 0;
                    while (iVar6 = (int)uVar30, iVar6 != 4) {
                      puVar37 = &DAT_00167d78;
                      uVar29 = 0;
                      while (uVar36 = (uint)uVar29, uVar36 != 4) {
                        iVar7 = xmlMemBlocks();
                        pxVar24 = gen_xmlOutputBufferPtr(iVar5,(int)in_RSI);
                        uVar9 = gen_int(iVar6,(int)in_RSI);
                        if (uVar36 < 3) {
                          pcVar19 = (char *)*puVar37;
                          sVar25 = strlen(pcVar19);
                          if ((int)uVar9 <= (int)sVar25 + 1) goto LAB_0013c1e8;
                        }
                        else {
                          pcVar19 = (char *)0x0;
LAB_0013c1e8:
                          in_RSI = (ulong)uVar9;
                          xmlOutputBufferWrite(pxVar24,in_RSI,pcVar19);
                          call_tests = call_tests + 1;
                          if (pxVar24 != (xmlOutputBufferPtr)0x0) {
                            xmlOutputBufferClose(pxVar24);
                          }
                          xmlResetLastError();
                          iVar8 = xmlMemBlocks();
                          if (iVar7 != iVar8) {
                            iVar8 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlOutputBufferWrite",
                                   (ulong)(uint)(iVar8 - iVar7));
                            local_58 = local_58 + 1;
                            printf(" %d",iVar5);
                            printf(" %d",uVar30);
                            printf(" %d");
                            putchar(10);
                            in_RSI = uVar29;
                          }
                        }
                        puVar37 = puVar37 + 1;
                        uVar29 = (ulong)(uVar36 + 1);
                      }
                      uVar30 = (ulong)(iVar6 + 1);
                    }
                    iVar5 = iVar5 + 1;
                  } while( true );
                }
                bVar35 = true;
                while (iVar6 = (int)in_RSI, bVar35) {
                  iVar7 = xmlMemBlocks();
                  pFVar23 = (FILE *)gen_FILE_ptr(iVar5,iVar6);
                  in_RSI = 0;
                  uVar17 = xmlOutputBufferCreateFile(pFVar23);
                  xmlOutputBufferClose(uVar17);
                  call_tests = call_tests + 1;
                  if (pFVar23 != (FILE *)0x0) {
                    fclose(pFVar23);
                  }
                  xmlResetLastError();
                  iVar6 = xmlMemBlocks();
                  if (iVar7 == iVar6) break;
                  iVar6 = xmlMemBlocks();
                  bVar35 = false;
                  printf("Leak of %d blocks found in xmlOutputBufferCreateFile",
                         (ulong)(uint)(iVar6 - iVar7));
                  local_84 = local_84 + 1;
                  printf(" %d");
                  in_RSI = 0;
                  printf(" %d");
                  putchar(10);
                }
                iVar5 = iVar5 + 1;
              } while( true );
            }
            bVar35 = true;
            while (iVar6 = (int)in_RSI, bVar35) {
              iVar7 = xmlMemBlocks();
              iVar6 = gen_int(iVar5,iVar6);
              in_RSI = 0;
              uVar17 = xmlOutputBufferCreateFd(iVar6);
              xmlOutputBufferClose(uVar17);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar7 == iVar6) break;
              iVar6 = xmlMemBlocks();
              bVar35 = false;
              printf("Leak of %d blocks found in xmlOutputBufferCreateFd",
                     (ulong)(uint)(iVar6 - iVar7));
              local_80 = local_80 + 1;
              printf(" %d");
              in_RSI = 0;
              printf(" %d");
              putchar(10);
            }
            iVar5 = iVar5 + 1;
          } while( true );
        }
        bVar35 = true;
        while (iVar6 = (int)in_RSI, bVar35) {
          iVar7 = xmlMemBlocks();
          pxVar22 = gen_xmlBufferPtr(iVar5,iVar6);
          in_RSI = 0;
          uVar17 = xmlOutputBufferCreateBuffer(pxVar22);
          xmlOutputBufferClose(uVar17);
          call_tests = call_tests + 1;
          if (pxVar22 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar22);
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar7 == iVar6) break;
          iVar6 = xmlMemBlocks();
          bVar35 = false;
          printf("Leak of %d blocks found in xmlOutputBufferCreateBuffer",
                 (ulong)(uint)(iVar6 - iVar7));
          local_7c = local_7c + 1;
          printf(" %d");
          in_RSI = 0;
          printf(" %d");
          putchar(10);
        }
        iVar5 = iVar5 + 1;
      } while( true );
    }
    bVar35 = true;
    while (iVar2 = (int)in_RSI, bVar35) {
      iVar3 = xmlMemBlocks();
      pxVar18 = gen_xmlParserCtxtPtr(iVar1,iVar2);
      in_RSI = 0;
      xmlCheckHTTPInput(pxVar18);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar18 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar3 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar35 = false;
      printf("Leak of %d blocks found in xmlCheckHTTPInput",(ulong)(uint)(iVar2 - iVar3));
      test_ret = test_ret + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

static int
test_xmlIO(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlIO : 40 of 50 functions ...\n");
    test_ret += test_xmlAllocOutputBuffer();
    test_ret += test_xmlAllocParserInputBuffer();
    test_ret += test_xmlCheckFilename();
    test_ret += test_xmlCheckHTTPInput();
    test_ret += test_xmlCleanupInputCallbacks();
    test_ret += test_xmlCleanupOutputCallbacks();
    test_ret += test_xmlFileClose();
    test_ret += test_xmlFileMatch();
    test_ret += test_xmlFileOpen();
    test_ret += test_xmlFileRead();
    test_ret += test_xmlIOFTPClose();
    test_ret += test_xmlIOFTPMatch();
    test_ret += test_xmlIOFTPOpen();
    test_ret += test_xmlIOFTPRead();
    test_ret += test_xmlIOHTTPClose();
    test_ret += test_xmlIOHTTPMatch();
    test_ret += test_xmlIOHTTPOpen();
    test_ret += test_xmlIOHTTPRead();
    test_ret += test_xmlNoNetExternalEntityLoader();
    test_ret += test_xmlNormalizeWindowsPath();
    test_ret += test_xmlOutputBufferCreateBuffer();
    test_ret += test_xmlOutputBufferCreateFd();
    test_ret += test_xmlOutputBufferCreateFile();
    test_ret += test_xmlOutputBufferCreateFilename();
    test_ret += test_xmlOutputBufferFlush();
    test_ret += test_xmlOutputBufferGetContent();
    test_ret += test_xmlOutputBufferGetSize();
    test_ret += test_xmlOutputBufferWrite();
    test_ret += test_xmlOutputBufferWriteEscape();
    test_ret += test_xmlOutputBufferWriteString();
    test_ret += test_xmlParserGetDirectory();
    test_ret += test_xmlParserInputBufferCreateFd();
    test_ret += test_xmlParserInputBufferCreateFile();
    test_ret += test_xmlParserInputBufferCreateFilename();
    test_ret += test_xmlParserInputBufferCreateMem();
    test_ret += test_xmlParserInputBufferCreateStatic();
    test_ret += test_xmlParserInputBufferGrow();
    test_ret += test_xmlParserInputBufferPush();
    test_ret += test_xmlParserInputBufferRead();
    test_ret += test_xmlPopInputCallbacks();
    test_ret += test_xmlRegisterDefaultInputCallbacks();
    test_ret += test_xmlRegisterDefaultOutputCallbacks();
    test_ret += test_xmlRegisterHTTPPostCallbacks();

    if (test_ret != 0)
	printf("Module xmlIO: %d errors\n", test_ret);
    return(test_ret);
}